

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Match_Size(FT_Face face,FT_Size_Request req,FT_Bool ignore_width,FT_ULong *size_index)

{
  int iVar1;
  FT_Error FVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  FT_Pos *pFVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  FT_ULong FVar10;
  bool bVar11;
  
  FVar2 = 0x23;
  if (((face->face_flags & 2) != 0) && (FVar2 = 7, req->type == FT_SIZE_REQUEST_TYPE_NOMINAL)) {
    lVar8 = req->width;
    if ((ulong)req->horiResolution != 0) {
      lVar7 = lVar8 * (ulong)req->horiResolution + 0x24;
      lVar8 = lVar7 >> 0x3f;
      lVar8 = (lVar7 / 0x12 + lVar8 >> 2) - lVar8;
    }
    lVar7 = req->height;
    if ((ulong)req->vertResolution != 0) {
      lVar7 = (long)(lVar7 * (ulong)req->vertResolution + 0x24) / 0x48;
    }
    lVar3 = lVar7;
    if (req->height == 0) {
      lVar3 = lVar8;
    }
    lVar4 = lVar3;
    if (req->width == 0) {
      lVar4 = lVar7;
      lVar8 = lVar3;
    }
    FVar2 = 0x17;
    uVar9 = lVar8 + 0x20U & 0xffffffffffffffc0;
    if (((uVar9 != 0) && (uVar5 = lVar4 + 0x20U & 0xffffffffffffffc0, uVar5 != 0)) &&
       (iVar1 = face->num_fixed_sizes, 0 < (long)iVar1)) {
      pFVar6 = &face->available_sizes->y_ppem;
      FVar10 = 0;
      while( true ) {
        bVar11 = false;
        if (uVar5 == (*pFVar6 + 0x20U & 0xffffffffffffffc0)) {
          bVar11 = uVar9 == (pFVar6[-1] + 0x20U & 0xffffffffffffffc0);
          if (size_index != (FT_ULong *)0x0 && (bVar11 || ignore_width != '\0')) {
            *size_index = FVar10;
            bVar11 = true;
          }
          else {
            bVar11 = bVar11 || ignore_width != '\0';
          }
        }
        if (bVar11) break;
        FVar10 = FVar10 + 1;
        pFVar6 = pFVar6 + 4;
        if ((long)iVar1 == FVar10) {
          return 0x17;
        }
      }
      return 0;
    }
  }
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Match_Size( FT_Face          face,
                 FT_Size_Request  req,
                 FT_Bool          ignore_width,
                 FT_ULong*        size_index )
  {
    FT_Int   i;
    FT_Long  w, h;


    if ( !FT_HAS_FIXED_SIZES( face ) )
      return FT_THROW( Invalid_Face_Handle );

    /* FT_Bitmap_Size doesn't provide enough info... */
    if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      return FT_THROW( Unimplemented_Feature );

    w = FT_REQUEST_WIDTH ( req );
    h = FT_REQUEST_HEIGHT( req );

    if ( req->width && !req->height )
      h = w;
    else if ( !req->width && req->height )
      w = h;

    w = FT_PIX_ROUND( w );
    h = FT_PIX_ROUND( h );

    if ( !w || !h )
      return FT_THROW( Invalid_Pixel_Size );

    for ( i = 0; i < face->num_fixed_sizes; i++ )
    {
      FT_Bitmap_Size*  bsize = face->available_sizes + i;


      if ( h != FT_PIX_ROUND( bsize->y_ppem ) )
        continue;

      if ( w == FT_PIX_ROUND( bsize->x_ppem ) || ignore_width )
      {
        FT_TRACE3(( "FT_Match_Size: bitmap strike %d matches\n", i ));

        if ( size_index )
          *size_index = (FT_ULong)i;

        return FT_Err_Ok;
      }
    }

    FT_TRACE3(( "FT_Match_Size: no matching bitmap strike\n" ));

    return FT_THROW( Invalid_Pixel_Size );
  }